

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.cpp
# Opt level: O3

void __thiscall
adios2::format::BPBase::SerialElementIndex::SerialElementIndex
          (SerialElementIndex *this,uint32_t memberID,size_t bufferSize)

{
  (this->Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->Count = 0;
  (this->Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->MemberID = memberID;
  this->LastUpdatedPosition = 0;
  this->Valid = false;
  this->CurrentStep = 0;
  this->CurrentHeaderPosition = 0;
  std::vector<char,_std::allocator<char>_>::reserve(&this->Buffer,bufferSize);
  return;
}

Assistant:

BPBase::SerialElementIndex::SerialElementIndex(const uint32_t memberID, const size_t bufferSize)
: MemberID(memberID)
{
    Buffer.reserve(bufferSize);
}